

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomLayoutItem::write(DomLayoutItem *this,int __fd,void *__buf,size_t __n)

{
  Kind KVar1;
  long lVar2;
  DomWidget *this_00;
  DomLayout *this_01;
  DomSpacer *this_02;
  char16_t *pcVar3;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar4._4_4_ = in_register_00000034;
  aVar4._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)((long)__buf + 0x10);
  if (lVar2 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"layoutitem";
    local_50.size = 10;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar6.m_size = (size_t)local_50.ptr;
  QVar6.field_0.m_data = aVar4.m_data;
  QXmlStreamWriter::writeStartElement(QVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar2 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_row == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"row",3);
    pcVar3 = local_50.ptr;
    aVar5.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_row);
    QVar7.m_size = (size_t)pcVar3;
    QVar7.field_0.m_data = aVar4.m_data;
    QVar12.m_size = (size_t)local_80.ptr;
    QVar12.field_0.m_data = aVar5.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar7,QVar12);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_column == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"column",6);
    pcVar3 = local_50.ptr;
    aVar5.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_column);
    QVar8.m_size = (size_t)pcVar3;
    QVar8.field_0.m_data = aVar4.m_data;
    QVar13.m_size = (size_t)local_80.ptr;
    QVar13.field_0.m_data = aVar5.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar8,QVar13);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_rowSpan == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"rowspan",7);
    pcVar3 = local_50.ptr;
    aVar5.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_rowSpan);
    QVar9.m_size = (size_t)pcVar3;
    QVar9.field_0.m_data = aVar4.m_data;
    QVar14.m_size = (size_t)local_80.ptr;
    QVar14.field_0.m_data = aVar5.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar9,QVar14);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_colSpan == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"colspan",7);
    pcVar3 = local_50.ptr;
    aVar5.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_colSpan);
    QVar10.m_size = (size_t)pcVar3;
    QVar10.field_0.m_data = aVar4.m_data;
    QVar15.m_size = (size_t)local_80.ptr;
    QVar15.field_0.m_data = aVar5.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar10,QVar15);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_alignment == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"alignment",9);
    QVar16.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_alignment).d.d;
    __n = (size_t)(this->m_attr_alignment).d.ptr;
    local_80.size = (this->m_attr_alignment).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar11.m_size = (size_t)local_50.ptr;
    QVar11.field_0.m_data = aVar4.m_data;
    QVar16.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar11,QVar16);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  KVar1 = this->m_kind;
  if (KVar1 == Spacer) {
    this_02 = this->m_spacer;
    if (this_02 == (DomSpacer *)0x0) goto LAB_00156360;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"spacer",6);
    DomSpacer::write(this_02,__fd,&local_50,__n);
  }
  else if (KVar1 == Layout) {
    this_01 = this->m_layout;
    if (this_01 == (DomLayout *)0x0) goto LAB_00156360;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"layout",6);
    DomLayout::write(this_01,__fd,&local_50,__n);
  }
  else {
    if ((KVar1 != Widget) || (this_00 = this->m_widget, this_00 == (DomWidget *)0x0))
    goto LAB_00156360;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"widget",6);
    DomWidget::write(this_00,__fd,&local_50,__n);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
LAB_00156360:
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomLayoutItem::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layoutitem") : tagName.toLower());

    if (hasAttributeRow())
        writer.writeAttribute(u"row"_s, QString::number(attributeRow()));

    if (hasAttributeColumn())
        writer.writeAttribute(u"column"_s, QString::number(attributeColumn()));

    if (hasAttributeRowSpan())
        writer.writeAttribute(u"rowspan"_s, QString::number(attributeRowSpan()));

    if (hasAttributeColSpan())
        writer.writeAttribute(u"colspan"_s, QString::number(attributeColSpan()));

    if (hasAttributeAlignment())
        writer.writeAttribute(u"alignment"_s, attributeAlignment());

    switch (kind()) {
    case Widget:
        if (m_widget != nullptr)
            m_widget->write(writer, u"widget"_s);
        break;

    case Layout:
        if (m_layout != nullptr)
            m_layout->write(writer, u"layout"_s);
        break;

    case Spacer:
        if (m_spacer != nullptr)
            m_spacer->write(writer, u"spacer"_s);
        break;

    default:
        break;
    }
    writer.writeEndElement();
}